

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

Value * __thiscall
kj::_::Debug::
ContextImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++:919:3)>
::evaluate(Value *__return_storage_ptr__,
          ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_test_c__:919:3)>
          *this)

{
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_test_c__:919:3)>
  *this_local;
  
  anon_unknown_0::TestCase915::run::anon_class_8_1_89917b6f::operator()
            (__return_storage_ptr__,this->func);
  return __return_storage_ptr__;
}

Assistant:

Value evaluate() override {
      return func();
    }